

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O2

base_learner * active_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  typed_option<float> *op;
  base_learner *l;
  single_learner *base;
  learner<active,_example> *plVar3;
  vw_exception *this;
  bool active_option;
  bool simulation;
  allocator local_43e;
  allocator local_43d;
  allocator local_43c;
  allocator local_43b;
  allocator local_43a;
  allocator local_439;
  free_ptr<active> data;
  string local_428 [32];
  string local_408;
  string local_3e8 [32];
  string local_3c8;
  string local_3a8 [32];
  string local_388;
  string local_368;
  string local_348;
  option_group_definition new_options;
  stringstream __msg;
  undefined1 local_2e0 [96];
  bool local_280;
  undefined1 local_168 [160];
  typed_option<float> local_c8;
  
  scoped_calloc_or_throw<active>();
  active_option = false;
  simulation = false;
  std::__cxx11::string::string((string *)&local_368,"Active Learning",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::string((string *)&local_388,"active",&local_439);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_388,&active_option);
  local_280 = true;
  std::__cxx11::string::string(local_3a8,"enable active learning",&local_43a);
  std::__cxx11::string::_M_assign((string *)(local_2e0 + 0x20));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&new_options,(typed_option<bool> *)&__msg);
  std::__cxx11::string::string((string *)&local_3c8,"simulation",&local_43b);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_168,&local_3c8,&simulation);
  std::__cxx11::string::string(local_3e8,"active learning simulation mode",&local_43c);
  std::__cxx11::string::_M_assign((string *)(local_168 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_168);
  std::__cxx11::string::string((string *)&local_408,"mellowness",&local_43d);
  VW::config::typed_option<float>::typed_option
            (&local_c8,&local_408,
             &(data._M_t.super___uniq_ptr_impl<active,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_active_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_active_*,_false>._M_head_impl)->active_c0);
  op = VW::config::typed_option<float>::default_value(&local_c8,8.0);
  std::__cxx11::string::string
            (local_428,"active learning mellowness parameter c_0. Default 8",&local_43e);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,op);
  std::__cxx11::string::~string(local_428);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string(local_3e8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_168);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string(local_3a8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_388);
  (**options->_vptr_options_i)(options,&new_options);
  if (active_option == false) {
    plVar3 = (learner<active,_example> *)0x0;
  }
  else {
    (data._M_t.super___uniq_ptr_impl<active,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_active_*,_void_(*)(void_*)>.super__Head_base<0UL,_active_*,_false>.
    _M_head_impl)->all = all;
    std::__cxx11::string::string((string *)&__msg,"lda",(allocator *)local_168);
    iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_2e0,"error: you can\'t combine lda and active learning");
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/active.cc"
                 ,0xa0,&local_348);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    std::__cxx11::string::string((string *)&__msg,"simulation",(allocator *)local_168);
    iVar1 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar1 == '\0') {
      all->active = true;
      plVar3 = LEARNER::init_learner<active,example,LEARNER::learner<char,example>>
                         (&data,base,predict_or_learn_active<true>,predict_or_learn_active<false>);
      *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
      *(code **)(plVar3 + 0x68) = return_active_example;
    }
    else {
      plVar3 = LEARNER::init_learner<active,example,LEARNER::learner<char,example>>
                         (&data,base,predict_or_learn_simulation<true>,
                          predict_or_learn_simulation<false>);
    }
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<active,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar3;
}

Assistant:

base_learner* active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active>();

  bool active_option = false;
  bool simulation = false;
  option_group_definition new_options("Active Learning");
  new_options.add(make_option("active", active_option).keep().help("enable active learning"))
      .add(make_option("simulation", simulation).help("active learning simulation mode"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8"));
  options.add_and_parse(new_options);

  if (!active_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  auto base = as_singleline(setup_base(options, all));

  // Create new learner
  learner<active, example>* l;
  if (options.was_supplied("simulation"))
    l = &init_learner(data, base, predict_or_learn_simulation<true>, predict_or_learn_simulation<false>);
  else
  {
    all.active = true;
    l = &init_learner(data, base, predict_or_learn_active<true>, predict_or_learn_active<false>);
    l->set_finish_example(return_active_example);
  }

  return make_base(*l);
}